

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O3

void duckdb_destroy_vector(duckdb_vector *vector)

{
  duckdb_vector p_Var1;
  Vector *dvector;
  
  if ((vector != (duckdb_vector *)0x0) && (p_Var1 = *vector, p_Var1 != (duckdb_vector)0x0)) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x60) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x60));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x50) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x50));
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x38) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x38));
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)(p_Var1 + 8));
    operator_delete(p_Var1);
    *vector = (duckdb_vector)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_vector(duckdb_vector *vector) {
	if (vector && *vector) {
		auto dvector = reinterpret_cast<duckdb::Vector *>(*vector);
		delete dvector;
		*vector = nullptr;
	}
}